

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

SysView ** __thiscall
r_code::vector<r_code::SysView_*>::operator[](vector<r_code::SysView_*> *this,size_t i)

{
  if ((ulong)(*(long *)(this + 8) - *(long *)this >> 3) <= i) {
    std::vector<r_code::SysView_*,_std::allocator<r_code::SysView_*>_>::resize
              ((vector<r_code::SysView_*,_std::allocator<r_code::SysView_*>_> *)this,i + 1);
  }
  if (i < (ulong)(*(long *)(this + 8) - *(long *)this >> 3)) {
    return (SysView **)(*(long *)this + i * 8);
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",i);
}

Assistant:

T &operator [](size_t i)
    {
        if (i >= size()) {
            m_vector.resize(i + 1);
        }

        return m_vector.at(i);
    }